

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

Option * __thiscall CLI::Option::check(Option *this,Validator *validator,string *validator_name)

{
  ulong uVar1;
  reference this_00;
  string local_40;
  string *local_20;
  string *validator_name_local;
  Validator *validator_local;
  Option *this_local;
  
  local_20 = validator_name;
  validator_name_local = (string *)validator;
  validator_local = (Validator *)this;
  Validator::non_modifying(validator,true);
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::push_back
            (&this->validators_,validator);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_00 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::back(&this->validators_)
    ;
    ::std::__cxx11::string::string((string *)&local_40,(string *)local_20);
    Validator::name(this_00,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return this;
}

Assistant:

Option *check(Validator validator, const std::string &validator_name = "") {
        validator.non_modifying();
        validators_.push_back(std::move(validator));
        if(!validator_name.empty())
            validators_.back().name(validator_name);
        return this;
    }